

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O2

void __thiscall booster::locale::util::gregorian_facet::~gregorian_facet(gregorian_facet *this)

{
  *(undefined ***)&this->super_calendar_facet = &PTR__gregorian_facet_001dc518;
  std::__cxx11::string::~string((string *)&this->terr_);
  std::locale::facet::~facet((facet *)this);
  return;
}

Assistant:

gregorian_facet(std::string const &terr,size_t refs = 0) : 
            calendar_facet(refs),
            terr_(terr)
        {
        }